

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O3

void __thiscall t_json_generator::generate_enum(t_json_generator *this,t_enum *tenum)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer pcVar3;
  t_enum_value *ptVar4;
  int iVar5;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  pointer pptVar7;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> values;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  start_object(this,true);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
  iVar5 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  lVar2 = *(long *)CONCAT44(extraout_var,iVar5);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar2,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar2);
  write_key_and_string(this,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((tenum->super_t_type).super_t_doc.has_doc_ == true) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"doc","");
    pcVar3 = (tenum->super_t_type).super_t_doc.doc_._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar3,
               pcVar3 + (tenum->super_t_type).super_t_doc.doc_._M_string_length);
    write_key_and_string(this,&local_d0,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if ((tenum->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"annotations","");
    write_key_and(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    start_object(this,true);
    p_Var6 = (tenum->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    p_Var1 = &(tenum->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,*(long *)(p_Var6 + 2),
                   (long)&(p_Var6[2]._M_parent)->_M_color + *(long *)(p_Var6 + 2));
        write_key_and_string(this,&local_148,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    end_object(this);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"members","");
  write_key_and(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  start_array(this);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            (&local_128,&tenum->constants_);
  if (local_128.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar7 = local_128.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      write_comma_if_needed(this);
      ptVar4 = *pptVar7;
      start_object(this,true);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"name","");
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      pcVar3 = (ptVar4->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar3,pcVar3 + (ptVar4->name_)._M_string_length);
      write_key_and_string(this,&local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"value","");
      write_key_and_integer(this,&local_1a8,ptVar4->value_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if ((ptVar4->super_t_doc).has_doc_ == true) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"doc","");
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        pcVar3 = (ptVar4->super_t_doc).doc_._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar3,pcVar3 + (ptVar4->super_t_doc).doc_._M_string_length)
        ;
        write_key_and_string(this,&local_1e8,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
      }
      end_object(this);
      indicate_comma_needed(this);
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_128.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  end_array(this);
  end_object(this);
  if (local_128.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_json_generator::generate_enum(t_enum* tenum) {
  start_object();

  write_key_and_string("name", tenum->get_name());

  if (tenum->has_doc()) {
    write_key_and_string("doc", tenum->get_doc());
  }

  if (tenum->annotations_.size() > 0) {
      write_key_and("annotations");
      start_object();
      for (auto & annotation : tenum->annotations_) {
        write_key_and_string(annotation.first, annotation.second);
      }
      end_object();
  }

  write_key_and("members");
  start_array();
  vector<t_enum_value*> values = tenum->get_constants();
  vector<t_enum_value*>::iterator val_iter;
  for (val_iter = values.begin(); val_iter != values.end(); ++val_iter) {
    write_comma_if_needed();
    t_enum_value* val = (*val_iter);
    start_object();
    write_key_and_string("name", val->get_name());
    write_key_and_integer("value", val->get_value());
    if (val->has_doc()) {
      write_key_and_string("doc", val->get_doc());
    }
    end_object();
    indicate_comma_needed();
  }
  end_array();

  end_object();
}